

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# em.cpp
# Opt level: O0

void __thiscall merlin::em::m_step(em *this)

{
  size_t sVar1;
  ostream *poVar2;
  size_type sVar3;
  factor *pfVar4;
  const_reference this_00;
  reference pvVar5;
  variable_set *pvVar6;
  size_t sVar7;
  vector<merlin::factor,_std::allocator<merlin::factor>_> *factors;
  value vVar8;
  variable vVar9;
  ulong local_460;
  size_t i_1;
  graphical_model local_440;
  value local_2b8;
  double v;
  size_t k;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  config;
  size_t j;
  config_index cv2;
  index_config cv1;
  factor new_th;
  variable_set scope;
  factor temp;
  factor sum;
  undefined1 local_98 [8];
  variable_set vx;
  int x;
  factor *th;
  size_t i;
  allocator<merlin::factor> local_31;
  undefined1 local_30 [8];
  vector<merlin::factor,_std::allocator<merlin::factor>_> new_thetas;
  vector<merlin::factor,_std::allocator<merlin::factor>_> *thetas;
  em *this_local;
  
  if ((this->m_debug & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[DEBUG] Begin M-step");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  new_thetas.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)graphical_model::get_factors(&this->m_gmo);
  sVar3 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::size
                    ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                     new_thetas.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<merlin::factor>::allocator(&local_31);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
            ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_30,sVar3,&local_31);
  std::allocator<merlin::factor>::~allocator(&local_31);
  th = (factor *)0x0;
  while( true ) {
    pfVar4 = (factor *)
             std::vector<merlin::factor,_std::allocator<merlin::factor>_>::size
                       ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                        new_thetas.
                        super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (pfVar4 <= th) {
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)&i_1,
                 (vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_30);
      graphical_model::graphical_model
                (&local_440,(vector<merlin::factor,_std::allocator<merlin::factor>_> *)&i_1);
      graphical_model::operator=(&this->m_gmo,&local_440);
      graphical_model::~graphical_model(&local_440);
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector
                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)&i_1);
      factors = graphical_model::get_factors(&this->m_gmo);
      cte::reinit(&this->m_infer,factors);
      if ((this->m_debug & 1U) != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"[DEBUG] End M-step");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,"[DEBUG] Updated parameters:");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        for (local_460 = 0;
            sVar3 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::size
                              ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_30),
            local_460 < sVar3; local_460 = local_460 + 1) {
          poVar2 = std::operator<<((ostream *)&std::cout,"[DEBUG]  ");
          pvVar5 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                             ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_30,
                              local_460);
          poVar2 = merlin::operator<<(poVar2,pvVar5);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
      }
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector
                ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_30);
      return;
    }
    this_00 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                        ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)
                         new_thetas.
                         super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage,(size_type)th);
    vx.m_d._4_4_ = factor::get_child(this_00);
    if (vx.m_d._4_4_ < 0) break;
    vVar9 = graphical_model::var(&this->m_gmo,(long)vx.m_d._4_4_);
    sum._88_8_ = vVar9.m_label;
    variable_set::variable_set((variable_set *)local_98,(variable *)&sum.c_);
    pvVar5 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                       (&this->m_counts,(size_type)th);
    factor::sum((factor *)&temp.c_,pvVar5,(variable_set *)local_98);
    pvVar5 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                       (&this->m_counts,(size_type)th);
    factor::operator/((factor *)&scope.m_d,pvVar5,(factor *)&temp.c_);
    pvVar6 = factor::vars(this_00);
    variable_set::variable_set((variable_set *)&new_th.c_,pvVar6);
    factor::factor((factor *)
                   &cv1.m_vars.
                    super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,this_00);
    index_config::index_config
              ((index_config *)
               &cv2.m_vars.super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(variable_set *)&new_th.c_,true);
    pvVar6 = factor::vars((factor *)&temp.c_);
    config_index::config_index((config_index *)&j,pvVar6,true);
    for (config._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        sVar1 = config._M_t._M_impl.super__Rb_tree_header._M_node_count,
        sVar7 = factor::num_states(this_00), sVar1 < sVar7;
        config._M_t._M_impl.super__Rb_tree_header._M_node_count =
             config._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
      index_config::convert
                ((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  *)&k,(index_config *)
                       &cv2.m_vars.
                        super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                 config._M_t._M_impl.super__Rb_tree_header._M_node_count);
      v = (double)config_index::convert
                            ((config_index *)&j,
                             (map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                              *)&k);
      vVar8 = factor::get((factor *)&temp.c_,(vsize)v);
      if ((vVar8 != 0.0) || (NAN(vVar8))) {
        local_2b8 = factor::get((factor *)&scope.m_d,
                                config._M_t._M_impl.super__Rb_tree_header._M_node_count);
        factor::set((factor *)
                    &cv1.m_vars.
                     super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage,
                    config._M_t._M_impl.super__Rb_tree_header._M_node_count,local_2b8);
      }
      std::
      map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ::~map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)&k);
    }
    pvVar5 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                       ((vector<merlin::factor,_std::allocator<merlin::factor>_> *)local_30,
                        (size_type)th);
    factor::operator=(pvVar5,(factor *)
                             &cv1.m_vars.
                              super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    config_index::~config_index((config_index *)&j);
    index_config::~index_config
              ((index_config *)
               &cv2.m_vars.super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    factor::~factor((factor *)
                    &cv1.m_vars.
                     super__Vector_base<merlin::variable,_std::allocator<merlin::variable>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage);
    variable_set::~variable_set((variable_set *)&new_th.c_);
    factor::~factor((factor *)&scope.m_d);
    factor::~factor((factor *)&temp.c_);
    variable_set::~variable_set((variable_set *)local_98);
    th = (factor *)((long)&th->_vptr_factor + 1);
  }
  __assert_fail("x >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/src/em.cpp",
                0x8f,"void merlin::em::m_step()");
}

Assistant:

void em::m_step() {

	if (m_debug) {
		std::cout << "[DEBUG] Begin M-step" << std::endl;
	}

	// Update the new parameters by dividing the corresponding counts
	const std::vector<factor>& thetas = m_gmo.get_factors();
	std::vector<factor> new_thetas(thetas.size());

	// counts factors must be aligned to the theta factors (by construction)
	for (size_t i = 0; i < thetas.size(); ++i) {
		const factor& th = thetas[i];
		int x = th.get_child();
		assert(x >= 0);

		variable_set vx(m_gmo.var(x));
		factor sum = m_counts[i].sum(vx);
		factor temp = m_counts[i] / sum;
		variable_set scope = th.vars();
		factor new_th = th; // copy the previous factor
		index_config cv1(scope, true);
		config_index cv2(sum.vars(), true);
		for (size_t j = 0; j < th.num_states(); ++j) {
			std::map<size_t, size_t> config = cv1.convert(j);
			size_t k = cv2.convert(config);
			if (sum.get(k) != 0) {
				double v = temp.get(j);
				new_th.set(j, v);
			}
		}

		new_thetas[i] = new_th;
	}

	// Set the new parameters (discard the old ones)
	m_gmo = graphical_model(new_thetas);
	m_infer.reinit(m_gmo.get_factors());
//	m_infer = cte(m_gmo);
//	m_infer.set_properties(m_properties);
//	m_infer.init(); // re-initialize the join tree

	if (m_debug) {
		std::cout << "[DEBUG] End M-step" << std::endl;
		std::cout << "[DEBUG] Updated parameters:" << std::endl;
		for (size_t i = 0; i < new_thetas.size(); ++i) {
			std::cout << "[DEBUG]  " << new_thetas[i] << std::endl;
		}
	}
}